

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtriebuilder.cpp
# Opt level: O1

UBool __thiscall
icu_63::StringTrieBuilder::SplitBranchNode::operator==(SplitBranchNode *this,Node *other)

{
  UBool UVar1;
  bool bVar2;
  
  if (this != (SplitBranchNode *)other) {
    UVar1 = Node::operator==((Node *)this,other);
    if (((UVar1 == '\0') ||
        (*(short *)&(this->super_BranchNode).field_0x14 !=
         *(short *)((long)&other[1].super_UObject._vptr_UObject + 4))) ||
       (this->lessThan != *(Node **)&other[1].hash)) {
      bVar2 = false;
    }
    else {
      bVar2 = this->greaterOrEqual == (Node *)other[2].super_UObject._vptr_UObject;
    }
    return bVar2;
  }
  return '\x01';
}

Assistant:

UBool
StringTrieBuilder::SplitBranchNode::operator==(const Node &other) const {
    if(this==&other) {
        return TRUE;
    }
    if(!Node::operator==(other)) {
        return FALSE;
    }
    const SplitBranchNode &o=(const SplitBranchNode &)other;
    return unit==o.unit && lessThan==o.lessThan && greaterOrEqual==o.greaterOrEqual;
}